

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O1

string * __thiscall
jaegertracing::net::IPAddress::host_abi_cxx11_(string *__return_storage_ptr__,IPAddress *this)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  int __af;
  char *__s;
  array<char,_46UL> buffer;
  char local_3e [46];
  
  if (this->_addrLen == 0x10) {
    __af = 2;
    lVar1 = 4;
  }
  else {
    if (this->_addrLen != 0x1c) {
      __assert_fail("_addrLen == sizeof(::sockaddr_in6)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/net/IPAddress.h"
                    ,0xb5,"int jaegertracing::net::IPAddress::family() const");
    }
    __af = 10;
    lVar1 = 8;
  }
  pcVar2 = inet_ntop(__af,(this->_addr).__ss_padding + lVar1 + -2,local_3e,0x2e);
  __s = "";
  if (pcVar2 != (char *)0x0) {
    __s = pcVar2;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string host() const
    {
        std::array<char, INET6_ADDRSTRLEN> buffer;
        const auto af = family();
        const auto* addrStr = ::inet_ntop(
            af,
            af == AF_INET
                ? const_cast<void*>(
                    static_cast<const void*>(
                        &reinterpret_cast<const ::sockaddr_in&>(_addr).sin_addr))
                : const_cast<void*>(
                    static_cast<const void*>(
                        &reinterpret_cast<const ::sockaddr_in6&>(_addr).sin6_addr)),
            &buffer[0],
            buffer.size());
        return addrStr ? addrStr : "";
    }